

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O3

void showWave(int num)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ResourceManager *this;
  void *pvVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 in_XMM1_Qa;
  char text [20];
  char acStack_38 [24];
  
  if (waveBitmap != (ALLEGRO_BITMAP *)0x0) {
    waveAngle = 0.0;
    al_destroy_bitmap();
    waveBitmap = (ALLEGRO_BITMAP *)0x0;
  }
  this = ResourceManager::getInstance();
  pvVar3 = ResourceManager::getData(this,3);
  sprintf(acStack_38,"WAVE %d",num);
  uVar1 = al_get_text_width(pvVar3,acStack_38);
  uVar2 = al_get_font_line_height(pvVar3);
  waveBitmap = (ALLEGRO_BITMAP *)al_create_bitmap(uVar1,uVar2);
  uVar4 = al_get_target_bitmap();
  al_set_target_bitmap(waveBitmap);
  al_map_rgba(0,0,0,0);
  al_clear_to_color();
  uVar5 = al_map_rgb(0xff,0xff,0xff);
  al_draw_textf(uVar5,in_XMM1_Qa,0,0,pvVar3,0,"%s",acStack_38);
  al_set_target_bitmap(uVar4);
  waveAngle = 6.2831855;
  return;
}

Assistant:

void showWave(int num)
{
   if (waveBitmap)
      stopWave();

   ResourceManager& rm = ResourceManager::getInstance();

   ALLEGRO_FONT *myfont = (ALLEGRO_FONT *)rm.getData(RES_LARGEFONT);
   
   char text[20];
   sprintf(text, "WAVE %d", num);

   int w = al_get_text_width(myfont, text);
   int h = al_get_font_line_height(myfont);

   waveBitmap = al_create_bitmap(w, h);
   ALLEGRO_BITMAP *old_target = al_get_target_bitmap();
   al_set_target_bitmap(waveBitmap);
   al_clear_to_color(al_map_rgba(0, 0, 0, 0));
   al_draw_textf(myfont, al_map_rgb(255, 255, 255), 0, 0, 0, "%s", text);
   al_set_target_bitmap(old_target);

   waveAngle = (ALLEGRO_PI*2);
}